

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O0

void * mem_leak_operator_new_array_debug(size_t size,char *file,size_t line)

{
  char *pcVar1;
  bad_alloc *this;
  size_t in_RDX;
  char *in_RSI;
  size_t in_RDI;
  TestMemoryAllocator *unaff_retaddr;
  MemoryLeakDetector *in_stack_00000008;
  void *memory;
  undefined8 in_stack_ffffffffffffffe0;
  undefined1 allocatNodesSeperately;
  
  allocatNodesSeperately = (undefined1)((ulong)in_stack_ffffffffffffffe0 >> 0x38);
  MemoryLeakWarningPlugin::getGlobalDetector();
  getCurrentNewArrayAllocator();
  pcVar1 = MemoryLeakDetector::allocMemory
                     (in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,in_RDX,
                      (bool)allocatNodesSeperately);
  if (pcVar1 == (char *)0x0) {
    this = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this);
    __cxa_throw(this,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return pcVar1;
}

Assistant:

UT_THROW(std::bad_alloc)
{
    void* memory = MemoryLeakWarningPlugin::getGlobalDetector()->allocMemory(getCurrentNewArrayAllocator(), size, file, line);
    UT_THROW_BAD_ALLOC_WHEN_NULL(memory);
    return memory;
}